

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int iOff;
  sqlite3_value *pOut;
  u8 *zBuf;
  u32 sz;
  ValueList *pRhs;
  int rc;
  u32 iSerial;
  Mem sMem;
  int dummy;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar4;
  int in_stack_ffffffffffffff74;
  BtCursor *in_stack_ffffffffffffff78;
  u32 amt;
  uchar *p;
  BtCursor *in_stack_ffffffffffffff80;
  int local_68;
  int local_50;
  undefined1 local_48 [8];
  uchar *local_40;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = 0;
  if (in_RDI == 0) {
    local_50 = sqlite3MisuseError(0);
  }
  else if (((*(ushort *)(in_RDI + 0x14) & 0x1000) == 0) ||
          (*(code **)(in_RDI + 0x30) != sqlite3VdbeValueListFree)) {
    local_50 = 1;
  }
  else {
    puVar1 = *(undefined8 **)(in_RDI + 8);
    if (in_EDX == 0) {
      local_c = 0;
      local_68 = sqlite3BtreeFirst((BtCursor *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   (int *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68));
      amt = (u32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      iVar3 = sqlite3BtreeEof((BtCursor *)*puVar1);
      if (iVar3 != 0) {
        local_68 = 0x65;
      }
    }
    else {
      local_68 = sqlite3BtreeNext(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      amt = (u32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    }
    if (local_68 == 0) {
      memcpy(local_48,&DAT_002ab4a8,0x38);
      memset(local_48,0,0x38);
      sqlite3BtreePayloadSize((BtCursor *)0x13ffd7);
      local_68 = sqlite3VdbeMemFromBtreeZeroOffset
                           (in_stack_ffffffffffffff80,amt,
                            (Mem *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (local_68 == 0) {
        p = (uchar *)puVar1[1];
        if (local_40[1] < 0x80) {
          uVar4 = 1;
        }
        else {
          bVar2 = sqlite3GetVarint32(p,(u32 *)CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70));
          uVar4 = (uint)bVar2;
        }
        sqlite3VdbeSerialGet(local_40,(u32)((ulong)p >> 0x20),(Mem *)CONCAT44(uVar4 + 1,uVar4));
        p[0x16] = *(uchar *)(*(long *)(p + 0x18) + 100);
        if (((*(ushort *)(p + 0x14) & 0x4000) == 0) ||
           (iVar3 = sqlite3VdbeMemMakeWriteable
                              ((Mem *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
           , iVar3 == 0)) {
          *in_RSI = p;
        }
        else {
          local_68 = 7;
        }
      }
      sqlite3VdbeMemRelease((Mem *)0x1400e4);
    }
    local_50 = local_68;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE_BKPT;
  if( (pVal->flags & MEM_Dyn)==0 || pVal->xDel!=sqlite3VdbeValueListFree ){
    return SQLITE_ERROR;
  }else{
    assert( (pVal->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype) );
    assert( pVal->eSubtype=='p' );
    assert( pVal->u.zPType!=0 && strcmp(pVal->u.zPType,"ValueList")==0 );
    pRhs = (ValueList*)pVal->z;
  }
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}